

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetrahedron_monte_carlo.cpp
# Opt level: O2

double tetrahedron01_monomial_integral(int *e)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  bool bVar7;
  double dVar8;
  double dVar9;
  
  lVar4 = 0;
  do {
    if (lVar4 == 3) {
      dVar8 = 1.0;
      iVar2 = 0;
      for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
        iVar3 = e[lVar4];
        if (iVar3 < 1) {
          iVar3 = 0;
        }
        dVar9 = 1.0;
        iVar6 = iVar3;
        iVar5 = iVar2;
        while( true ) {
          iVar5 = iVar5 + 1;
          bVar7 = iVar6 == 0;
          iVar6 = iVar6 + -1;
          if (bVar7) break;
          dVar8 = (dVar8 * dVar9) / (double)iVar5;
          dVar9 = dVar9 + 1.0;
        }
        iVar2 = iVar2 + iVar3;
      }
      for (iVar3 = 1; iVar3 != 4; iVar3 = iVar3 + 1) {
        dVar8 = dVar8 / (double)(iVar2 + iVar3);
      }
      return dVar8;
    }
    piVar1 = e + lVar4;
    lVar4 = lVar4 + 1;
  } while (-1 < *piVar1);
  std::operator<<((ostream *)&std::cerr,"\n");
  std::operator<<((ostream *)&std::cerr,"TETRAHEDRON01_MONOMIAL_INTEGRAL - Fatal error!\n");
  std::operator<<((ostream *)&std::cerr,"  All exponents must be nonnegative.\n");
  exit(1);
}

Assistant:

double tetrahedron01_monomial_integral ( int e[] )

//****************************************************************************80
//
//  Purpose:
//
//    TETRAHEDRON01_MONOMIAL_INTEGRAL: integrals in the unit tetrahedron in 3D.
//
//  Discussion:
//
//    The monomial is F(X,Y,Z) = X^E(1) * Y^E(2) * Z^E(3).
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    15 January 2014
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int E[3], the exponents.  
//    Each exponent must be nonnegative.
//
//    Output, double TETRAHEDRON01_MONOMIAL_INTEGRAL, the integral.
//
{
  int i;
  double integral;
  int j;
  int k;
  const int m = 3;

  for ( i = 0; i < m; i++ )
  {
    if ( e[i] < 0 )
    {
      std::cerr << "\n";
      std::cerr << "TETRAHEDRON01_MONOMIAL_INTEGRAL - Fatal error!\n";
      std::cerr << "  All exponents must be nonnegative.\n";
      exit ( 1 );
    }
  }

  k = 0;
  integral = 1.0;

  for ( i = 0; i < m; i++ )
  {
    for ( j = 1; j <= e[i]; j++ )
    {
      k = k + 1;
      integral = integral * double( j ) / double( k );
    }
  }

  for ( i = 0; i < m; i++ )
  {
    k = k + 1;
    integral = integral / double( k );
  }

  return integral;
}